

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O1

uint256 * GetPackageHash(uint256 *__return_storage_ptr__,
                        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *transactions)

{
  byte bVar1;
  pointer psVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  base_blob<256U> *pbVar11;
  iterator iVar12;
  ulong uVar13;
  uchar *puVar14;
  transaction_identifier<true> *ptVar15;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *__range1;
  long lVar16;
  __normal_iterator<transaction_identifier<true>_*,_std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  __i;
  pointer psVar17;
  long lVar18;
  transaction_identifier<true> *ptVar19;
  transaction_identifier<true> *wtxid;
  uchar *puVar20;
  long in_FS_OFFSET;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> wtxids_copy;
  HashWriter hashwriter;
  transaction_identifier<true> *local_b8;
  iterator iStack_b0;
  transaction_identifier<true> *local_a8;
  CSHA256 local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = (transaction_identifier<true> *)0x0;
  iStack_b0._M_current = (transaction_identifier<true> *)0x0;
  local_a8 = (transaction_identifier<true> *)0x0;
  psVar17 = (transactions->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (transactions->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar17 != psVar2) {
    do {
      peVar3 = (psVar17->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_98.s._0_8_ =
           *(undefined8 *)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_98.s._8_8_ =
           *(undefined8 *)
            ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      local_98.s._16_8_ =
           *(undefined8 *)
            ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_98.s._24_8_ =
           *(undefined8 *)
            ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      if (iStack_b0._M_current == local_a8) {
        std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
        _M_realloc_insert<transaction_identifier<true>>
                  ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                    *)&local_b8,iStack_b0,(transaction_identifier<true> *)&local_98);
      }
      else {
        uVar4 = *(undefined8 *)
                 (peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar5 = *(undefined8 *)
                 ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8
                 );
        uVar6 = *(undefined8 *)
                 ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                 0x18);
        *(undefined8 *)
         (((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10) =
             *(undefined8 *)
              ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
              );
        *(undefined8 *)
         (((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar6;
        *(undefined8 *)((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems =
             uVar4;
        *(undefined8 *)
         (((iStack_b0._M_current)->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8) = uVar5;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      psVar17 = psVar17 + 1;
    } while (psVar17 != psVar2);
  }
  iVar12._M_current = (transaction_identifier<true> *)iStack_b0;
  ptVar15 = local_b8;
  if (local_b8 != iStack_b0._M_current) {
    lVar18 = (long)iStack_b0._M_current - (long)local_b8;
    uVar13 = lVar18 >> 5;
    lVar16 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
              (local_b8,iStack_b0._M_current,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar18 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
                (ptVar15,iVar12._M_current);
    }
    else {
      ptVar19 = ptVar15 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<transaction_identifier<true>*,std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<GetPackageHash(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>>
                (ptVar15);
      if (ptVar19 != iVar12._M_current) {
        puVar20 = ptVar15[0xf].m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1f;
        do {
          uVar4 = *(undefined8 *)(ptVar19->m_wrapped).super_base_blob<256U>.m_data._M_elems;
          uVar5 = *(undefined8 *)((ptVar19->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
          uVar6 = *(undefined8 *)((ptVar19->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10)
          ;
          uVar7 = *(undefined8 *)((ptVar19->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18)
          ;
          local_98.s[4] = (uint32_t)uVar6;
          local_98.s[5] = SUB84(uVar6,4);
          local_98.s[6] = (uint32_t)uVar7;
          local_98.s[7] = SUB84(uVar7,4);
          local_98.s[0] = (uint32_t)uVar4;
          local_98.s[1] = SUB84(uVar4,4);
          local_98.s[2] = (uint32_t)uVar5;
          local_98.s[3] = SUB84(uVar5,4);
          puVar14 = puVar20;
          ptVar15 = ptVar19;
          while( true ) {
            lVar16 = 0;
            while( true ) {
              bVar1 = *(byte *)((long)local_98.s + lVar16 + 0x1f);
              if (puVar14[lVar16] != bVar1) break;
              lVar16 = lVar16 + -1;
              if (lVar16 == -0x20) goto LAB_00289c73;
            }
            if (puVar14[lVar16] <= bVar1) break;
            uVar8 = *(undefined8 *)ptVar15[-1].m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar9 = *(undefined8 *)(ptVar15[-1].m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
            ;
            uVar10 = *(undefined8 *)
                      (ptVar15[-1].m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            *(undefined8 *)((ptVar15->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10) =
                 *(undefined8 *)(ptVar15[-1].m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
            ;
            *(undefined8 *)((ptVar15->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18) =
                 uVar10;
            *(undefined8 *)(ptVar15->m_wrapped).super_base_blob<256U>.m_data._M_elems = uVar8;
            *(undefined8 *)((ptVar15->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8) = uVar9;
            puVar14 = puVar14 + -0x20;
            ptVar15 = ptVar15 + -1;
          }
LAB_00289c73:
          *(undefined8 *)((ptVar15->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar6
          ;
          *(undefined8 *)((ptVar15->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7
          ;
          *(undefined8 *)(ptVar15->m_wrapped).super_base_blob<256U>.m_data._M_elems = uVar4;
          *(undefined8 *)((ptVar15->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8) = uVar5;
          ptVar19 = ptVar19 + 1;
          puVar20 = puVar20 + 0x20;
        } while (ptVar19 != iVar12._M_current);
      }
    }
  }
  CSHA256::CSHA256(&local_98);
  iVar12._M_current = (transaction_identifier<true> *)iStack_b0;
  if (local_b8 != iStack_b0._M_current) {
    ptVar15 = local_b8;
    do {
      CSHA256::Write(&local_98,(uchar *)ptVar15,0x20);
      ptVar15 = ptVar15 + 1;
    } while (ptVar15 != iVar12._M_current);
  }
  pbVar11 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x10] = '\0';
  (pbVar11->m_data)._M_elems[0x11] = '\0';
  (pbVar11->m_data)._M_elems[0x12] = '\0';
  (pbVar11->m_data)._M_elems[0x13] = '\0';
  (pbVar11->m_data)._M_elems[0x14] = '\0';
  (pbVar11->m_data)._M_elems[0x15] = '\0';
  (pbVar11->m_data)._M_elems[0x16] = '\0';
  (pbVar11->m_data)._M_elems[0x17] = '\0';
  pbVar11 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x18] = '\0';
  (pbVar11->m_data)._M_elems[0x19] = '\0';
  (pbVar11->m_data)._M_elems[0x1a] = '\0';
  (pbVar11->m_data)._M_elems[0x1b] = '\0';
  (pbVar11->m_data)._M_elems[0x1c] = '\0';
  (pbVar11->m_data)._M_elems[0x1d] = '\0';
  (pbVar11->m_data)._M_elems[0x1e] = '\0';
  (pbVar11->m_data)._M_elems[0x1f] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar11 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[8] = '\0';
  (pbVar11->m_data)._M_elems[9] = '\0';
  (pbVar11->m_data)._M_elems[10] = '\0';
  (pbVar11->m_data)._M_elems[0xb] = '\0';
  (pbVar11->m_data)._M_elems[0xc] = '\0';
  (pbVar11->m_data)._M_elems[0xd] = '\0';
  (pbVar11->m_data)._M_elems[0xe] = '\0';
  (pbVar11->m_data)._M_elems[0xf] = '\0';
  CSHA256::Finalize(&local_98,(uchar *)__return_storage_ptr__);
  if (local_b8 != (transaction_identifier<true> *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

uint256 GetPackageHash(const std::vector<CTransactionRef>& transactions)
{
    // Create a vector of the wtxids.
    std::vector<Wtxid> wtxids_copy;
    std::transform(transactions.cbegin(), transactions.cend(), std::back_inserter(wtxids_copy),
        [](const auto& tx){ return tx->GetWitnessHash(); });

    // Sort in ascending order
    std::sort(wtxids_copy.begin(), wtxids_copy.end(), [](const auto& lhs, const auto& rhs) {
        return std::lexicographical_compare(std::make_reverse_iterator(lhs.end()), std::make_reverse_iterator(lhs.begin()),
                                            std::make_reverse_iterator(rhs.end()), std::make_reverse_iterator(rhs.begin()));
    });

    // Get sha256 hash of the wtxids concatenated in this order
    HashWriter hashwriter;
    for (const auto& wtxid : wtxids_copy) {
        hashwriter << wtxid;
    }
    return hashwriter.GetSHA256();
}